

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O3

void __thiscall FTeam::ParseTeamInfo(FTeam *this)

{
  bool bVar1;
  int lumpnum;
  FScanner *this_00;
  int iLastLump;
  FScanner Scan;
  int local_134;
  FScanner local_130;
  
  local_134 = 0;
  if (Teams.Count != 0) {
    TArray<FTeam,_FTeam>::DoDelete(&Teams,0,Teams.Count - 1);
    Teams.Count = 0;
  }
  lumpnum = FWadCollection::FindLump(&Wads,"TEAMINFO",&local_134,false);
  if (lumpnum != -1) {
    do {
      FScanner::FScanner(&local_130,lumpnum);
      while( true ) {
        bVar1 = FScanner::GetString(&local_130);
        if (!bVar1) break;
        bVar1 = FScanner::Compare(&local_130,"ClearTeams");
        if (bVar1) {
          if (Teams.Count != 0) {
            TArray<FTeam,_FTeam>::DoDelete(&Teams,0,Teams.Count - 1);
            Teams.Count = 0;
          }
        }
        else {
          this_00 = &local_130;
          bVar1 = FScanner::Compare(&local_130,"Team");
          if (bVar1) {
            ParseTeamDefinition((FTeam *)this_00,&local_130);
          }
          else {
            FScanner::ScriptError
                      (&local_130,"ParseTeamInfo: Unknown team command \'%s\'.\n",local_130.String);
          }
        }
      }
      FScanner::~FScanner(&local_130);
      lumpnum = FWadCollection::FindLump(&Wads,"TEAMINFO",&local_134,false);
    } while (lumpnum != -1);
  }
  if (Teams.Count < 2) {
    I_FatalError("ParseTeamInfo: At least two teams must be defined in TEAMINFO.");
  }
  else if (0x10 < Teams.Count) {
    I_FatalError("ParseTeamInfo: Too many teams defined. (Maximum: %d)",0x10);
  }
  return;
}

Assistant:

void FTeam::ParseTeamInfo ()
{
	int iLump, iLastLump = 0;

	Teams.Clear();
	while ((iLump = Wads.FindLump ("TEAMINFO", &iLastLump)) != -1)
	{
		FScanner Scan (iLump);

		while (Scan.GetString ())
		{
			if (Scan.Compare ("ClearTeams"))
				ClearTeams ();
			else if (Scan.Compare ("Team"))
				ParseTeamDefinition (Scan);
			else
				Scan.ScriptError ("ParseTeamInfo: Unknown team command '%s'.\n", Scan.String);
		}
	}

	if (Teams.Size () < 2)
		I_FatalError ("ParseTeamInfo: At least two teams must be defined in TEAMINFO.");
	else if (Teams.Size () > (unsigned)TEAM_MAXIMUM)
		I_FatalError ("ParseTeamInfo: Too many teams defined. (Maximum: %d)", TEAM_MAXIMUM);
}